

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strncpy_63(UChar *dst,UChar *src,int32_t n)

{
  UChar UVar1;
  bool bVar2;
  UChar *anchor;
  UChar *pUStack_18;
  int32_t n_local;
  UChar *src_local;
  UChar *dst_local;
  
  anchor._4_4_ = n;
  pUStack_18 = src;
  src_local = dst;
  while( true ) {
    bVar2 = false;
    if (0 < anchor._4_4_) {
      UVar1 = *pUStack_18;
      *src_local = UVar1;
      bVar2 = UVar1 != L'\0';
      pUStack_18 = pUStack_18 + 1;
      src_local = src_local + 1;
    }
    if (!bVar2) break;
    anchor._4_4_ = anchor._4_4_ + -1;
  }
  return dst;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_strncpy(UChar     *dst, 
     const UChar     *src, 
     int32_t     n) 
{
    UChar *anchor = dst;            /* save a pointer to start of dst */

    /* copy string 2 over */
    while(n > 0 && (*(dst++) = *(src++)) != 0) {
        --n;
    }

    return anchor;
}